

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  Pgno PVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Pgno pgno_00;
  u32 key;
  long in_FS_OFFSET;
  u8 eType;
  Pgno pgno;
  MemPage *pPage;
  long local_38;
  
  iVar2 = sqlite3PendingByte;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPage = (MemPage *)0x0;
  if (pBt->autoVacuum == '\0') {
LAB_0013b71d:
    iVar2 = btreeGetPage(pBt,ovfl,&pPage,(uint)(ppPage == (MemPage **)0x0) * 2);
    if (iVar2 == 0) {
      key = sqlite3Get4byte(pPage->aData);
      iVar2 = 0;
      goto LAB_0013b787;
    }
  }
  else {
    pgno = 0xaaaaaaaa;
    eType = 0xaa;
    pgno_00 = ovfl;
    do {
      do {
        uVar4 = pgno_00;
        pgno_00 = uVar4 + 1;
        PVar1 = ptrmapPageno(pBt,pgno_00);
      } while (pgno_00 == PVar1);
    } while (uVar4 == (uint)iVar2 / pBt->pageSize);
    key = uVar4 + 1;
    if (pBt->nPage < key) goto LAB_0013b71d;
    iVar2 = ptrmapGet(pBt,key,&eType,&pgno);
    if ((iVar2 == 0) && (eType == '\x04')) {
      if (pgno == ovfl) {
        iVar2 = 0x65;
        goto LAB_0013b787;
      }
      goto LAB_0013b71d;
    }
    if (iVar2 == 0) goto LAB_0013b71d;
  }
  key = 0;
LAB_0013b787:
  *pPgnoNext = key;
  if (ppPage == (MemPage **)0x0) {
    releasePage(pPage);
  }
  else {
    *ppPage = pPage;
  }
  iVar3 = 0;
  if (iVar2 != 0x65) {
    iVar3 = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in
  ** the overflow list is page number (ovfl+1). If that guess turns
  ** out to be wrong, fall back to loading the data of page
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, (ppPage==0) ? PAGER_GET_READONLY : 0);
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}